

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O1

void __thiscall
IceMaths::Point::ProjectToScreen
          (Point *this,float halfrenderwidth,float halfrenderheight,Matrix4x4 *mat,HPoint *projected
          )

{
  float fVar1;
  HPoint local_30;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_30.super_Point.x = this->x;
  local_30.super_Point.y = this->y;
  local_30.super_Point.z = this->z;
  local_30.w = 1.0;
  HPoint::operator*(&local_30,mat);
  (projected->super_Point).x = (float)(undefined4)local_20;
  (projected->super_Point).y = (float)local_20._4_4_;
  *(undefined8 *)&(projected->super_Point).z = uStack_18;
  fVar1 = 1.0 / projected->w;
  projected->w = fVar1;
  (projected->super_Point).z = fVar1 * (projected->super_Point).z;
  (projected->super_Point).x =
       (projected->super_Point).x * fVar1 * halfrenderwidth + halfrenderwidth;
  (projected->super_Point).y =
       halfrenderheight - (projected->super_Point).y * fVar1 * halfrenderheight;
  return;
}

Assistant:

void Point::ProjectToScreen(float halfrenderwidth, float halfrenderheight, const Matrix4x4& mat, HPoint& projected) const
{
	projected = HPoint(x, y, z, 1.0f) * mat;
	projected.w = 1.0f / projected.w;

	projected.x*=projected.w;
	projected.y*=projected.w;
	projected.z*=projected.w;

	projected.x *= halfrenderwidth;		projected.x += halfrenderwidth;
	projected.y *= -halfrenderheight;	projected.y += halfrenderheight;
}